

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O0

bool __thiscall bloaty::ArgParser::TryParseIntegerOption(ArgParser *this,string_view flag,int *val)

{
  string_view str;
  string_view value;
  string_view value_00;
  bool bVar1;
  char *in_RDX;
  size_t in_RSI;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  string_view *in_stack_00000010;
  ArgParser *in_stack_00000018;
  string_view in_stack_00000020;
  string_view val_str;
  Nonnull<int_*> in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  undefined1 *puVar2;
  Arg *in_stack_ffffffffffffff08;
  string_view in_stack_ffffffffffffff10;
  Arg local_b8;
  undefined1 local_78 [32];
  size_t local_58;
  Arg *local_50;
  size_t local_48;
  char *local_40;
  basic_string_view<char,_std::char_traits<char>_> local_38 [2];
  size_t local_18;
  char *pcStack_10;
  bool local_1;
  
  local_18 = in_RSI;
  pcStack_10 = in_RDX;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_38);
  local_48 = local_18;
  local_40 = pcStack_10;
  bVar1 = TryParseOption(in_stack_00000018,in_stack_00000020,in_stack_00000010);
  if (bVar1) {
    local_58 = local_38[0]._M_len;
    local_50 = (Arg *)local_38[0]._M_str;
    str._M_len._4_4_ = in_stack_fffffffffffffedc;
    str._M_len._0_4_ = in_stack_fffffffffffffed8;
    str._M_str = (char *)in_RDI;
    bVar1 = absl::SimpleAtoi<int>(str,in_stack_fffffffffffffed0);
    if (!bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_RDI,(char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      value_00._M_str = pcStack_10;
      value_00._M_len = local_18;
      absl::substitute_internal::Arg::Arg(&local_b8,value_00);
      value._M_str = local_38[0]._M_str;
      value._M_len = local_38[0]._M_len;
      absl::substitute_internal::Arg::Arg((Arg *)&stack0xffffffffffffff08,value);
      puVar2 = local_78;
      absl::Substitute_abi_cxx11_
                (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,(Arg *)local_38[0]._M_str);
      std::__cxx11::string::c_str();
      Throw((char *)in_RDI,(int)((ulong)puVar2 >> 0x20));
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool TryParseIntegerOption(string_view flag, int* val) {
    string_view val_str;
    if (!TryParseOption(flag, &val_str)) {
      return false;
    }

    if (!absl::SimpleAtoi(val_str, val)) {
      THROWF("option '$0' had non-integral argument: $1", flag, val_str);
    }

    return true;
  }